

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Halfword read_halfword(FILE *ifp)

{
  size_t sVar1;
  Halfword local_12;
  FILE *pFStack_10;
  anon_union_2_2_94730027 ret;
  FILE *ifp_local;
  
  pFStack_10 = ifp;
  sVar1 = fread(&local_12,1,2,(FILE *)ifp);
  if (sVar1 != 2) {
    error("Read error!");
  }
  return local_12;
}

Assistant:

Halfword
read_halfword(FILE *ifp)
{
	union
	{
		Halfword h;
		Byte b[sizeof(Halfword)];
	}
	ret;

	if (fread((char *) &ret.h, 1, sizeof(Halfword), ifp)!=sizeof(Halfword)) {
		error("Read error!");
	}
#if defined(__MSDOS__)
	/* MSDOS reads bytes in the correct order.  Save a bit of time
	 * by returning the value */
	return (ret.h);
#else
	/* Ensure the data is in the correct order */
	return (ret.b[0] | ret.b[1] << 8);
#endif
}